

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2i(char *cval,long *ival,int *status)

{
  int iVar1;
  double local_f8;
  double dval;
  char local_e8 [4];
  int lval;
  char msg [81];
  char local_88 [8];
  char sval [81];
  char local_29;
  int *piStack_28;
  char dtype;
  int *status_local;
  long *ival_local;
  char *cval_local;
  
  if (*status < 1) {
    if (*cval == '\0') {
      *status = 0xcc;
      cval_local._4_4_ = 0xcc;
    }
    else {
      piStack_28 = status;
      status_local = (int *)ival;
      ival_local = (long *)cval;
      ffc2x(cval,&local_29,ival,(int *)((long)&dval + 4),local_88,&local_f8,status);
      if (local_29 == 'X') {
        *piStack_28 = 0x193;
      }
      else if (local_29 == 'C') {
        iVar1 = ffc2dd(local_88,&local_f8,piStack_28);
        if (iVar1 < 1) {
          if ((9.223372036854776e+18 < local_f8) || (local_f8 < -9.223372036854776e+18)) {
            *piStack_28 = 0x19c;
          }
          else {
            *(long *)status_local = (long)local_f8;
          }
        }
      }
      else if (local_29 == 'F') {
        if ((9.223372036854776e+18 < local_f8) || (local_f8 < -9.223372036854776e+18)) {
          *piStack_28 = 0x19c;
        }
        else {
          *(long *)status_local = (long)local_f8;
        }
      }
      else if (local_29 == 'L') {
        *(long *)status_local = (long)dval._4_4_;
      }
      if (*piStack_28 < 1) {
        cval_local._4_4_ = *piStack_28;
      }
      else {
        status_local[0] = 0;
        status_local[1] = 0;
        strcpy(local_e8,"Error in ffc2i evaluating string as an integer: ");
        strncat(local_e8,(char *)ival_local,0x1e);
        ffpmsg(local_e8);
        cval_local._4_4_ = *piStack_28;
      }
    }
  }
  else {
    cval_local._4_4_ = *status;
  }
  return cval_local._4_4_;
}

Assistant:

int ffc2i(const char *cval,   /* I - string representation of the value */
          long *ival,         /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to an integer value, doing implicit
  datatype conversion if necessary.
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */
        
    /* convert the keyword to its native datatype */
    ffc2x(cval, &dtype, ival, &lval, sval, &dval, status);

    if (dtype == 'X' )
    {
            *status = BAD_INTKEY;
    }
    else if (dtype == 'C')
    {
            /* try reading the string as a number */
            if (ffc2dd(sval, &dval, status) <= 0)
            {
              if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
              else
                *ival = (long) dval;
            }
    }
    else if (dtype == 'F')
    {
            if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *ival = (long) dval;
    }
    else if (dtype == 'L')
    {
            *ival = (long) lval;
    }

    if (*status > 0)
    {
            *ival = 0;
            strcpy(msg,"Error in ffc2i evaluating string as an integer: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }


    return(*status);
}